

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

size_t __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer(timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer,op_queue<boost::asio::detail::scheduler_operation> *ops,
              size_t max_cancelled)

{
  wait_op *pwVar1;
  scheduler_operation *psVar2;
  size_t sVar3;
  
  if ((timer->prev_ == (per_timer_data *)0x0) && (this->timers_ != timer)) {
    max_cancelled = 0;
  }
  else {
    for (sVar3 = 0; pwVar1 = (timer->op_queue_).front_, max_cancelled != sVar3; sVar3 = sVar3 + 1) {
      if (pwVar1 == (wait_op *)0x0) goto LAB_0011e8f0;
      system::error_code::operator=(&pwVar1->ec_,operation_aborted);
      op_queue<boost::asio::detail::wait_op>::pop(&timer->op_queue_);
      (pwVar1->super_operation).next_ = (scheduler_operation *)0x0;
      psVar2 = ops->back_;
      if (ops->back_ == (scheduler_operation *)0x0) {
        psVar2 = (scheduler_operation *)ops;
      }
      psVar2->next_ = &pwVar1->super_operation;
      ops->back_ = &pwVar1->super_operation;
    }
    sVar3 = max_cancelled;
    if (pwVar1 == (wait_op *)0x0) {
LAB_0011e8f0:
      remove_timer(this,timer);
      max_cancelled = sVar3;
    }
  }
  return max_cancelled;
}

Assistant:

std::size_t cancel_timer(per_timer_data& timer, op_queue<operation>& ops,
      std::size_t max_cancelled = (std::numeric_limits<std::size_t>::max)())
  {
    std::size_t num_cancelled = 0;
    if (timer.prev_ != 0 || &timer == timers_)
    {
      while (wait_op* op = (num_cancelled != max_cancelled)
          ? timer.op_queue_.front() : 0)
      {
        op->ec_ = boost::asio::error::operation_aborted;
        timer.op_queue_.pop();
        ops.push(op);
        ++num_cancelled;
      }
      if (timer.op_queue_.empty())
        remove_timer(timer);
    }
    return num_cancelled;
  }